

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qdatetimeedit.cpp
# Opt level: O3

void QDateEdit::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  undefined8 *puVar1;
  undefined8 uVar2;
  long in_FS_OFFSET;
  undefined8 local_40;
  void *local_38;
  undefined8 *local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (_id == 0 && _c == InvokeMetaMethod) {
    local_40 = *_a[1];
    local_30 = &local_40;
    local_38 = (void *)0x0;
    QMetaObject::activate(_o,&staticMetaObject,0,&local_38);
  }
  if (_c == ReadProperty) {
    if (_id == 0) {
      puVar1 = (undefined8 *)*_a;
      uVar2 = ::QVariant::toDate();
      *puVar1 = uVar2;
    }
  }
  else if (_c == WriteProperty) {
    if (_id == 0) {
      QDateTimeEdit::setDate((QDateTimeEdit *)_o,(QDate)**_a);
    }
  }
  else if (((_c == IndexOfMethod) && (*_a[1] == userDateChanged)) &&
          (*(long *)((long)_a[1] + 8) == 0)) {
    *(undefined4 *)*_a = 0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QDateEdit::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QDateEdit *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->userDateChanged((*reinterpret_cast< std::add_pointer_t<QDate>>(_a[1]))); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QDateEdit::*)(QDate )>(_a, &QDateEdit::userDateChanged, 0))
            return;
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<QDate*>(_v) = _t->date(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setDate(*reinterpret_cast<QDate*>(_v)); break;
        default: break;
        }
    }
}